

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O1

bool google::protobuf::util::anon_unknown_4::WithinFractionOrMargin<float>
               (float x,float y,float fraction,float margin)

{
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar1;
  void *p;
  CommonFields *this;
  float fVar2;
  float fVar3;
  RawHashSetLayout RStack_48;
  
  if (((0.0 <= fraction) && (fraction < 1.0)) && (0.0 <= margin)) {
    if ((uint)ABS(y) < 0x7f800000 && (uint)ABS(x) < 0x7f800000) {
      fVar2 = ABS(y);
      if (ABS(y) <= ABS(x)) {
        fVar2 = ABS(x);
      }
      fVar3 = fVar2 * fraction;
      if (fVar2 * fraction <= margin) {
        fVar3 = margin;
      }
      return ABS(x - y) <= fVar3;
    }
    return false;
  }
  this = (CommonFields *)&stack0xfffffffffffffff0;
  (anonymous_namespace)::WithinFractionOrMargin<float>((_anonymous_namespace_ *)this);
  uVar1 = extraout_AL;
  if (this->capacity_ != 0) {
    if ((this->size_ & 1) != 0) {
      absl::lts_20240722::container_internal::CommonFields::backing_array_start(this);
    }
    p = absl::lts_20240722::container_internal::CommonFields::backing_array_start(this);
    absl::lts_20240722::container_internal::RawHashSetLayout::RawHashSetLayout
              (&RStack_48,this->capacity_,8,(bool)((byte)(int)this->size_ & 1));
    absl::lts_20240722::container_internal::
    Deallocate<8ul,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::SimpleFieldComparator::Tolerance>>>
              ((allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::SimpleFieldComparator::Tolerance>_>
                *)this,p,RStack_48.capacity_ * 0x18 + RStack_48.slot_offset_);
    uVar1 = extraout_AL_00;
  }
  return (bool)uVar1;
}

Assistant:

bool WithinFractionOrMargin(const T x, const T y, const T fraction,
                            const T margin) {
  ABSL_DCHECK(fraction >= T(0) && fraction < T(1) && margin >= T(0));

  if (!std::isfinite(x) || !std::isfinite(y)) {
    return false;
  }
  const T relative_margin = fraction * std::max(std::fabs(x), std::fabs(y));
  return std::fabs(x - y) <= std::max(margin, relative_margin);
}